

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O3

void __thiscall pg::QPTSolver::liftloop(QPTSolver *this)

{
  char cVar1;
  uint *puVar2;
  bool bVar3;
  int target;
  ostream *poVar4;
  Game *pGVar5;
  Error *this_00;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  int from;
  uint uVar13;
  ulong uVar14;
  int *piVar15;
  _label_vertex local_48;
  uint *local_38;
  
  lVar8 = ((this->super_Solver).game)->n_vertices;
  if (0 < this->k * lVar8) {
    piVar15 = this->pm_nodes;
    lVar7 = 0;
    do {
      piVar15[lVar7] = -1;
      lVar7 = lVar7 + 1;
      lVar9 = this->k * lVar8;
    } while (lVar9 - lVar7 != 0 && lVar7 <= lVar9);
  }
  if (0 < lVar8) {
    memset(this->strategy,0xff,lVar8 * 4);
  }
  uVar13 = (int)lVar8 - 1;
  if (-1 < (int)uVar13) {
    uVar14 = (ulong)uVar13;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
        this->lift_attempt = this->lift_attempt + 1;
        bVar3 = lift(this,(int)uVar14,-1);
        if (bVar3) {
          this->lift_count = this->lift_count + 1;
          todo_push(this,(int)uVar14);
        }
      }
      bVar3 = 0 < (long)uVar14;
      uVar14 = uVar14 - 1;
    } while (bVar3);
  }
  while ((this->todo).pointer != 0) {
    target = todo_pop(this);
    pGVar5 = (this->super_Solver).game;
    piVar15 = pGVar5->_inedges;
    lVar8 = (long)pGVar5->_firstins[target];
    iVar6 = piVar15[lVar8];
    if (iVar6 != -1) {
      piVar15 = piVar15 + lVar8 + 1;
      do {
        if ((((this->super_Solver).disabled)->_bits[(ulong)(long)iVar6 >> 6] >>
             ((long)iVar6 & 0x3fU) & 1) == 0) {
          this->lift_attempt = this->lift_attempt + 1;
          bVar3 = lift(this,iVar6,target);
          if (bVar3) {
            this->lift_count = this->lift_count + 1;
            todo_push(this,iVar6);
          }
        }
        iVar6 = *piVar15;
        piVar15 = piVar15 + 1;
      } while (iVar6 != -1);
    }
  }
  pGVar5 = (this->super_Solver).game;
  lVar8 = pGVar5->n_vertices;
  if ((this->super_Solver).trace != 0) {
    if (lVar8 < 1) goto LAB_0016969b;
    uVar14 = 0;
    do {
      uVar11 = uVar14 >> 6;
      if ((((this->super_Solver).disabled)->_bits[uVar11] >> (uVar14 & 0x3f) & 1) == 0) {
        poVar4 = (this->super_Solver).logger;
        uVar12 = 1L << (uVar14 & 0x3f);
        local_38 = (uint *)(this->pm_nodes + (long)this->k * (long)(int)uVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[1m",4);
        local_48.g = (this->super_Solver).game;
        local_48.v = (int)uVar14;
        poVar4 = operator<<(poVar4,&local_48);
        pcVar10 = " (odd)";
        bVar3 = ((((this->super_Solver).game)->_owner)._bits[uVar11] & uVar12) == 0;
        if (bVar3) {
          pcVar10 = " (even)";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar10,(ulong)bVar3 | 6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[m:",4);
        puVar2 = local_38;
        pm_stream((this->super_Solver).logger,(int *)local_38,this->k);
        if ((*puVar2 == 0xffffffff || (*puVar2 & 1) != this->pl) &&
           (this->pl != (uint)(((((this->super_Solver).game)->_owner)._bits[uVar11] & uVar12) != 0))
           ) {
          poVar4 = (this->super_Solver).logger;
          if (this->strategy[uVar14] == -1) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," no strategy!",0xd);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," => ",4);
            local_48.g = (this->super_Solver).game;
            local_48.v = this->strategy[uVar14];
            operator<<(poVar4,&local_48);
          }
        }
        poVar4 = (this->super_Solver).logger;
        cVar1 = (char)poVar4;
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        pGVar5 = (this->super_Solver).game;
        lVar8 = pGVar5->n_vertices;
      }
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < lVar8);
  }
  if (0 < lVar8) {
    uVar14 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
        uVar13 = this->pl;
        if (this->pm_nodes[(long)(int)uVar14 * (long)this->k] == 0xffffffff ||
            (this->pm_nodes[(long)(int)uVar14 * (long)this->k] & 1U) != uVar13) {
          iVar6 = -1;
          if ((uVar13 != (((pGVar5->_owner)._bits[uVar14 >> 6] & 1L << (uVar14 & 0x3f)) != 0)) &&
             (iVar6 = this->strategy[uVar14], iVar6 == -1)) {
            this_00 = (Error *)__cxa_allocate_exception(0x40);
            Error::Error(this_00,"logic error",
                         "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/qpt.cpp"
                         ,0x1d4);
            __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
          }
          Oink::solve((this->super_Solver).oink,(int)uVar14,1 - uVar13,iVar6);
          pGVar5 = (this->super_Solver).game;
          lVar8 = pGVar5->n_vertices;
        }
      }
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < lVar8);
  }
LAB_0016969b:
  Oink::flush((this->super_Solver).oink);
  return;
}

Assistant:

void
QPTSolver::liftloop()
{
    /**
     * Initialize/reset progress measures / strategy
     */
    for (int i=0; i<k*nodecount(); i++) pm_nodes[i] = -1; // initialize all to _
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    /**
     * Run first lifting loop
     */
    for (int n=nodecount()-1; n>=0; n--) {
        if (disabled[n]) continue;
        lift_attempt++;
        if (lift(n, -1)) {
            lift_count++;
#if 0
            for (int from : in[n]) {
                if (disabled[from]) continue;
                lift_attempt++;
                if (lift(from, n)) {
                    lift_count++;
                    todo_push(from);
                }
            }
#else
            todo_push(n);
#endif
        }
    }

    /**
     * Lift until fixed point
     */
    while (!todo.empty()) {
        int n = todo_pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            if (disabled[from]) continue;
            lift_attempt++;
            if (lift(from, n)) {
                lift_count++;
                todo_push(from);
            }
        }
    }

    /**
     * Report final state.
     */
    if (trace) {
        for (int v=0; v<nodecount(); v++) {
            if (disabled[v]) continue;
            int *pm = pm_nodes + v*k;

            logger << "\033[1m" << label_vertex(v) << (owner(v)?" (odd)":" (even)") << "\033[m:";
            pm_stream(logger, pm, k);

            if (pm[0] == -1 or (pm[0]&1) != pl) {
                if (owner(v) != pl) {
                    if (strategy[v] == -1) logger << " no strategy!";
                    else logger << " => " << label_vertex(strategy[v]);
                }
            }
            
            logger << std::endl;
        }
    }

    /**
     * Derive strategies, mark as solved (only for opponent).
     */
    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        int *pm = pm_nodes + v*k;

        if (pm[0] == -1 or (pm[0]&1) != pl) {
            if (owner(v) != pl and strategy[v] == -1) LOGIC_ERROR;
            Solver::solve(v, 1-pl, owner(v) != pl ? strategy[v] : -1);
        }
    }

    Solver::flush();
}